

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1load.c
# Opt level: O1

void parse_subrs(T1_Face face,T1_Loader loader)

{
  FT_Memory memory;
  undefined8 *puVar1;
  FT_Byte *pFVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  FT_Pointer __dest;
  long lVar7;
  FT_Hash hash;
  uint uVar8;
  ulong uVar9;
  FT_Error error;
  FT_ULong size;
  FT_Byte *base;
  FT_Error local_74;
  FT_Memory local_70;
  ulong local_68;
  FT_Pointer local_60;
  size_t local_58;
  PS_Table local_50;
  ulong local_48;
  undefined8 *local_40;
  FT_Byte *local_38;
  
  memory = (loader->parser).root.memory;
  puVar1 = (undefined8 *)face->psaux;
  (*(loader->parser).root.funcs.skip_spaces)((PS_Parser)loader);
  pFVar2 = (loader->parser).root.cursor;
  if ((pFVar2 < (loader->parser).root.limit) && (*pFVar2 == '[')) {
    (*(loader->parser).root.funcs.skip_PS_token)((PS_Parser)loader);
    (*(loader->parser).root.funcs.skip_spaces)((PS_Parser)loader);
    pFVar2 = (loader->parser).root.cursor;
    if ((pFVar2 < (loader->parser).root.limit) && (*pFVar2 == ']')) {
      return;
    }
LAB_00179c31:
    (loader->parser).root.error = 3;
    return;
  }
  uVar6 = (*(loader->parser).root.funcs.to_int)((PS_Parser)loader);
  if ((int)(uint)uVar6 < 0) goto LAB_00179c31;
  pFVar2 = (loader->parser).root.limit;
  local_70 = memory;
  local_40 = puVar1;
  if (((loader->parser).root.cursor <= pFVar2) &&
     (uVar9 = (long)pFVar2 - (long)(loader->parser).root.cursor >> 3,
     (long)uVar9 < (long)(ulong)((uint)uVar6 & 0x7fffffff))) {
    if (loader->subrs_hash == (FT_Hash)0x0) {
      hash = (FT_Hash)ft_mem_alloc(memory,0x28,&local_74);
      loader->subrs_hash = hash;
      if (local_74 != 0) goto switchD_00179a7d_caseD_4;
      local_74 = ft_hash_num_init(hash,local_70);
      uVar6 = uVar9 & 0xffffffff;
      if (local_74 != 0) goto switchD_00179a7d_caseD_4;
    }
    else {
      uVar6 = uVar9 & 0xffffffff;
    }
  }
  (*(loader->parser).root.funcs.skip_PS_token)((PS_Parser)loader);
  if ((loader->parser).root.error != 0) {
    return;
  }
  local_50 = &loader->subrs;
  (*(loader->parser).root.funcs.skip_spaces)((PS_Parser)loader);
  if ((loader->num_subrs != 0) ||
     (local_74 = (**(code **)*local_40)(local_50,uVar6 & 0xffffffff,local_70), local_74 == 0)) {
    uVar8 = 0;
    do {
      pFVar2 = (loader->parser).root.cursor;
      iVar5 = 5;
      if ((pFVar2 + 4 < (loader->parser).root.limit) &&
         (iVar4 = strncmp((char *)pFVar2,"dup",3), iVar4 == 0)) {
        (*(loader->parser).root.funcs.skip_PS_token)((PS_Parser)loader);
        local_68 = (*(loader->parser).root.funcs.to_int)((PS_Parser)loader);
        iVar4 = read_binary_data(&loader->parser,&local_48,&local_38,
                                 ((face->root).internal)->incremental_interface !=
                                 (FT_Incremental_InterfaceRec *)0x0);
        iVar5 = 1;
        if ((iVar4 != 0) &&
           ((*(loader->parser).root.funcs.skip_PS_token)((PS_Parser)loader),
           (loader->parser).root.error == 0)) {
          (*(loader->parser).root.funcs.skip_spaces)((PS_Parser)loader);
          pFVar2 = (loader->parser).root.cursor;
          if ((pFVar2 + 4 < (loader->parser).root.limit) &&
             (iVar5 = strncmp((char *)pFVar2,"put",3), iVar5 == 0)) {
            (*(loader->parser).root.funcs.skip_PS_token)((PS_Parser)loader);
            (*(loader->parser).root.funcs.skip_spaces)((PS_Parser)loader);
          }
          if (loader->subrs_hash != (FT_Hash)0x0) {
            ft_hash_num_insert((FT_Int)local_68,(ulong)uVar8,loader->subrs_hash,local_70);
            local_68 = (ulong)uVar8;
          }
          iVar5 = 7;
          if (loader->num_subrs == 0) {
            uVar9 = (ulong)(face->type1).private_dict.lenIV;
            if ((long)uVar9 < 0) {
              local_74 = (*(loader->subrs).funcs.add)
                                   (local_50,(FT_Int)local_68,local_38,(FT_UInt)local_48);
            }
            else {
              if (local_48 < uVar9) {
                local_74 = 3;
LAB_00179b98:
                iVar5 = 4;
                bVar3 = false;
              }
              else {
                local_58 = local_48;
                __dest = ft_mem_alloc(local_70,local_48,&local_74);
                iVar5 = 0;
                if (local_74 != 0) goto LAB_00179b98;
                local_60 = __dest;
                memcpy(__dest,local_38,local_58);
                (*(code *)local_40[4])(local_60,local_58,0x10ea);
                lVar7 = (long)(face->type1).private_dict.lenIV;
                local_48 = local_58 - lVar7;
                local_74 = (*(loader->subrs).funcs.add)
                                     (local_50,(FT_Int)local_68,(void *)((long)local_60 + lVar7),
                                      (FT_UInt)local_48);
                ft_mem_free(local_70,local_60);
                bVar3 = true;
              }
              if (!bVar3) goto LAB_00179a68;
            }
            iVar5 = (uint)(local_74 != 0) << 2;
          }
        }
      }
LAB_00179a68:
      switch(iVar5) {
      case 0:
      case 7:
        uVar8 = uVar8 + 1;
        break;
      default:
        return;
      case 4:
        goto switchD_00179a7d_caseD_4;
      case 5:
        if (loader->num_subrs != 0) {
          return;
        }
        loader->num_subrs = (FT_Int)uVar6;
        return;
      }
    } while( true );
  }
switchD_00179a7d_caseD_4:
  (loader->parser).root.error = local_74;
  return;
}

Assistant:

static void
  parse_subrs( T1_Face    face,
               T1_Loader  loader )
  {
    T1_Parser  parser = &loader->parser;
    PS_Table   table  = &loader->subrs;
    FT_Memory  memory = parser->root.memory;
    FT_Error   error;
    FT_Int     num_subrs;
    FT_UInt    count;

    PSAux_Service  psaux = (PSAux_Service)face->psaux;


    T1_Skip_Spaces( parser );

    /* test for empty array */
    if ( parser->root.cursor < parser->root.limit &&
         *parser->root.cursor == '['              )
    {
      T1_Skip_PS_Token( parser );
      T1_Skip_Spaces  ( parser );
      if ( parser->root.cursor >= parser->root.limit ||
           *parser->root.cursor != ']'               )
        parser->root.error = FT_THROW( Invalid_File_Format );
      return;
    }

    num_subrs = (FT_Int)T1_ToInt( parser );
    if ( num_subrs < 0 )
    {
      parser->root.error = FT_THROW( Invalid_File_Format );
      return;
    }

    /* we certainly need more than 8 bytes per subroutine */
    if ( parser->root.limit >= parser->root.cursor                     &&
         num_subrs > ( parser->root.limit - parser->root.cursor ) >> 3 )
    {
      /*
       * There are two possibilities.  Either the font contains an invalid
       * value for `num_subrs', or we have a subsetted font where the
       * subroutine indices are not adjusted, e.g.
       *
       *   /Subrs 812 array
       *     dup 0 { ... } NP
       *     dup 51 { ... } NP
       *     dup 681 { ... } NP
       *   ND
       *
       * In both cases, we use a number hash that maps from subr indices to
       * actual array elements.
       */

      FT_TRACE0(( "parse_subrs: adjusting number of subroutines"
                  " (from %d to %d)\n",
                  num_subrs,
                  ( parser->root.limit - parser->root.cursor ) >> 3 ));
      num_subrs = ( parser->root.limit - parser->root.cursor ) >> 3;

      if ( !loader->subrs_hash )
      {
        if ( FT_NEW( loader->subrs_hash ) )
          goto Fail;

        error = ft_hash_num_init( loader->subrs_hash, memory );
        if ( error )
          goto Fail;
      }
    }

    /* position the parser right before the `dup' of the first subr */
    T1_Skip_PS_Token( parser );         /* `array' */
    if ( parser->root.error )
      return;
    T1_Skip_Spaces( parser );

    /* initialize subrs array -- with synthetic fonts it is possible */
    /* we get here twice                                             */
    if ( !loader->num_subrs )
    {
      error = psaux->ps_table_funcs->init( table, num_subrs, memory );
      if ( error )
        goto Fail;
    }

    /* the format is simple:   */
    /*                         */
    /*   `index' + binary data */
    /*                         */
    for ( count = 0; ; count++ )
    {
      FT_Long   idx;
      FT_ULong  size;
      FT_Byte*  base;


      /* If we are out of data, or if the next token isn't `dup', */
      /* we are done.                                             */
      if ( parser->root.cursor + 4 >= parser->root.limit          ||
          ft_strncmp( (char*)parser->root.cursor, "dup", 3 ) != 0 )
        break;

      T1_Skip_PS_Token( parser );       /* `dup' */

      idx = T1_ToInt( parser );

      if ( !read_binary_data( parser, &size, &base, IS_INCREMENTAL ) )
        return;

      /* The binary string is followed by one token, e.g. `NP' */
      /* (bound to `noaccess put') or by two separate tokens:  */
      /* `noaccess' & `put'.  We position the parser right     */
      /* before the next `dup', if any.                        */
      T1_Skip_PS_Token( parser );   /* `NP' or `|' or `noaccess' */
      if ( parser->root.error )
        return;
      T1_Skip_Spaces  ( parser );

      if ( parser->root.cursor + 4 < parser->root.limit            &&
           ft_strncmp( (char*)parser->root.cursor, "put", 3 ) == 0 )
      {
        T1_Skip_PS_Token( parser ); /* skip `put' */
        T1_Skip_Spaces  ( parser );
      }

      /* if we use a hash, the subrs index is the key, and a running */
      /* counter specified for `T1_Add_Table' acts as the value      */
      if ( loader->subrs_hash )
      {
        ft_hash_num_insert( idx, count, loader->subrs_hash, memory );
        idx = count;
      }

      /* with synthetic fonts it is possible we get here twice */
      if ( loader->num_subrs )
        continue;

      /* some fonts use a value of -1 for lenIV to indicate that */
      /* the charstrings are unencoded                           */
      /*                                                         */
      /* thanks to Tom Kacvinsky for pointing this out           */
      /*                                                         */
      if ( face->type1.private_dict.lenIV >= 0 )
      {
        FT_Byte*  temp = NULL;


        /* some fonts define empty subr records -- this is not totally */
        /* compliant to the specification (which says they should at   */
        /* least contain a `return'), but we support them anyway       */
        if ( size < (FT_ULong)face->type1.private_dict.lenIV )
        {
          error = FT_THROW( Invalid_File_Format );
          goto Fail;
        }

        /* t1_decrypt() shouldn't write to base -- make temporary copy */
        if ( FT_ALLOC( temp, size ) )
          goto Fail;
        FT_MEM_COPY( temp, base, size );
        psaux->t1_decrypt( temp, size, 4330 );
        size -= (FT_ULong)face->type1.private_dict.lenIV;
        error = T1_Add_Table( table, (FT_Int)idx,
                              temp + face->type1.private_dict.lenIV, size );
        FT_FREE( temp );
      }
      else
        error = T1_Add_Table( table, (FT_Int)idx, base, size );
      if ( error )
        goto Fail;
    }

    if ( !loader->num_subrs )
      loader->num_subrs = num_subrs;

    return;

  Fail:
    parser->root.error = error;
  }